

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

opj_bool opj_set_decoded_resolution_factor(opj_codec_t *p_codec,OPJ_UINT32 res_factor)

{
  undefined4 in_ESI;
  long in_RDI;
  opj_codec_private_t *l_codec;
  uint local_4;
  
  if (in_RDI != 0) {
    (**(code **)(in_RDI + 0x48))
              (*(undefined8 *)(in_RDI + 0x50),in_ESI,*(undefined8 *)(in_RDI + 0x58));
  }
  else {
    fprintf(_stderr,"[ERROR] Input parameters of the setup_decoder function are incorrect.\n");
  }
  local_4 = (uint)(in_RDI != 0);
  return local_4;
}

Assistant:

opj_bool OPJ_CALLCONV opj_set_decoded_resolution_factor(opj_codec_t *p_codec, OPJ_UINT32 res_factor)
{
	opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

	if ( !l_codec ){
		fprintf(stderr, "[ERROR] Input parameters of the setup_decoder function are incorrect.\n");
		return OPJ_FALSE;
	}


	l_codec->m_codec_data.m_decompression.opj_set_decoded_resolution_factor(l_codec->m_codec, res_factor, l_codec->m_event_mgr);

	return OPJ_TRUE;
}